

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

FlattenLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_flatten(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  FlattenLayerParams *pFVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_flatten(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_flatten(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pFVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::FlattenLayerParams>(arena);
    (this->layer_).flatten_ = pFVar2;
  }
  return (FlattenLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FlattenLayerParams* NeuralNetworkLayer::_internal_mutable_flatten() {
  if (!_internal_has_flatten()) {
    clear_layer();
    set_has_flatten();
    layer_.flatten_ = CreateMaybeMessage< ::CoreML::Specification::FlattenLayerParams >(GetArenaForAllocation());
  }
  return layer_.flatten_;
}